

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_time.cc
# Opt level: O3

int ASN1_TIME_diff(int *out_days,int *out_seconds,ASN1_TIME *from,ASN1_TIME *to)

{
  int iVar1;
  int iVar2;
  tm tm_to;
  tm tm_from;
  tm local_90;
  tm local_58;
  
  iVar1 = asn1_time_to_tm(&local_58,from,1);
  iVar2 = 0;
  if (iVar1 != 0) {
    iVar1 = asn1_time_to_tm(&local_90,to,1);
    iVar2 = 0;
    if (iVar1 != 0) {
      iVar2 = OPENSSL_gmtime_diff(out_days,out_seconds,&local_58,&local_90);
    }
  }
  return iVar2;
}

Assistant:

int ASN1_TIME_diff(int *out_days, int *out_seconds, const ASN1_TIME *from,
                   const ASN1_TIME *to) {
  struct tm tm_from, tm_to;
  if (!asn1_time_to_tm(&tm_from, from, /*allow_timezone_offset=*/1)) {
    return 0;
  }
  if (!asn1_time_to_tm(&tm_to, to, /*allow_timezone_offset=*/1)) {
    return 0;
  }
  return OPENSSL_gmtime_diff(out_days, out_seconds, &tm_from, &tm_to);
}